

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::pumpTo
          (BlockedPumpFrom *this,AsyncOutputStream *output,uint64_t amount2)

{
  AsyncOutputStream *adapterConstructorParams;
  PromiseArena *pPVar1;
  SourceLocation location;
  PromiseBase PVar2;
  OwnPromiseNode OVar3;
  void *pvVar4;
  ulong in_RCX;
  ulong uVar5;
  TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:825:17),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:447:12)>
  *location_00;
  bool bVar6;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  DebugExpression<bool> _kjCondition;
  Fault f;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_b0;
  OwnPromiseNode local_a8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a0;
  code *local_98;
  char *local_90;
  char *pcStack_88;
  undefined8 local_80;
  PromiseBase local_78;
  anon_class_16_2_d8ee3cd1_for_errorHandler local_70;
  anon_class_32_4_39723cd8_for_func local_60;
  OwnPromiseNode local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  bVar6 = output[7]._vptr_AsyncOutputStream == (_func_int **)0x0;
  local_90 = (char *)CONCAT71(local_90._1_7_,bVar6);
  local_78.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  if (bVar6) {
    adapterConstructorParams = output + 7;
    uVar5 = (long)output[5]._vptr_AsyncOutputStream - (long)output[6]._vptr_AsyncOutputStream;
    if (in_RCX < uVar5) {
      uVar5 = in_RCX;
    }
    (**(code **)(*output[4]._vptr_AsyncOutputStream + 0x18))
              (&local_b0,output[4]._vptr_AsyncOutputStream,amount2,uVar5);
    local_70.fulfiller = (PromiseFulfiller<unsigned_long> *)output[2]._vptr_AsyncOutputStream;
    local_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
    ;
    pcStack_88 = "pumpTo";
    local_80 = 0x1c00000338;
    local_98 = kj::_::
               TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:825:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
               ::anon_class_32_4_39723cd8_for_func::operator();
    pPVar1 = ((local_b0.ptr)->super_PromiseArenaMember).arena;
    local_70.canceler = (Canceler *)adapterConstructorParams;
    local_60.this = (BlockedPumpFrom *)output;
    local_60.output = (AsyncOutputStream *)amount2;
    local_60.n = uVar5;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_b0.ptr - (long)pPVar1) < 0x50) {
      pvVar4 = operator_new(0x400);
      location_00 = (TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:825:17),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:447:12)>
                     *)((long)pvVar4 + 0x3b0);
      ctor<kj::_::TransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_00,&local_b0,&local_60,&local_70,&local_98);
      *(void **)((long)pvVar4 + 0x3b8) = pvVar4;
    }
    else {
      ((local_b0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      location_00 = (TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:825:17),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:447:12)>
                     *)(local_b0.ptr + -5);
      ctor<kj::_::TransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_00,&local_b0,&local_60,&local_70,&local_98);
      local_b0.ptr[-5].super_PromiseArenaMember.arena = pPVar1;
    }
    location.function = pcStack_88;
    location.fileName = local_90;
    location.lineNumber = (undefined4)local_80;
    location.columnNumber = local_80._4_4_;
    local_a0.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<unsigned_long>(&local_40,(Promise<unsigned_long> *)&local_a0,location);
    OVar3.ptr = local_40.ptr;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
    local_a8.ptr = OVar3.ptr;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a0);
    PVar2.node.ptr = local_78.node.ptr;
    newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
              ((kj *)local_78.node.ptr,(Canceler *)adapterConstructorParams,
               (Promise<unsigned_long> *)&local_a8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_b0);
    return (Promise<unsigned_long>)(PromiseNode *)PVar2.node.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
            ((Fault *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x335,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
             (DebugExpression<bool> *)&local_90,(char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal((Fault *)&local_60);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}